

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttcmap.c
# Opt level: O0

FT_UInt32 * tt_cmap14_get_def_chars(TT_CMap cmap,FT_Byte *p,FT_Memory memory)

{
  void **ppvVar1;
  FT_UInt FVar2;
  FT_Error FVar3;
  uint local_44;
  FT_CMap_Class pFStack_40;
  FT_UInt32 uni;
  FT_UInt32 *q;
  FT_UInt cnt;
  FT_UInt32 numRanges;
  TT_CMap14 cmap14;
  FT_Memory memory_local;
  FT_Byte *p_local;
  TT_CMap cmap_local;
  
  FVar2 = tt_cmap14_def_char_count(p);
  memory_local = (FT_Memory)(p + 4);
  q._4_4_ = (uint)*p << 0x18 | (uint)p[1] << 0x10 | (uint)p[2] << 8 | (uint)p[3];
  FVar3 = tt_cmap14_ensure((TT_CMap14)cmap,FVar2 + 1,memory);
  if (FVar3 == 0) {
    pFStack_40 = cmap[1].cmap.clazz;
    for (; q._4_4_ != 0; q._4_4_ = q._4_4_ - 1) {
      ppvVar1 = &memory_local->user;
      local_44 = (uint)*(byte *)&memory_local->user << 0x10 |
                 (uint)*(byte *)((long)&memory_local->user + 1) << 8 |
                 (uint)*(byte *)((long)&memory_local->user + 2);
      memory_local = (FT_Memory)((long)&memory_local->user + 4);
      q._0_4_ = *(byte *)((long)ppvVar1 + 3) + 1;
      do {
        *(uint *)&pFStack_40->size = local_44;
        local_44 = local_44 + 1;
        pFStack_40 = (FT_CMap_Class)((long)&pFStack_40->size + 4);
        q._0_4_ = (int)q + -1;
      } while ((int)q != 0);
    }
    *(undefined4 *)&pFStack_40->size = 0;
    cmap_local = (TT_CMap)cmap[1].cmap.clazz;
  }
  else {
    cmap_local = (TT_CMap)0x0;
  }
  return (FT_UInt32 *)cmap_local;
}

Assistant:

static FT_UInt32*
  tt_cmap14_get_def_chars( TT_CMap    cmap,
                           FT_Byte*   p,
                           FT_Memory  memory )
  {
    TT_CMap14   cmap14 = (TT_CMap14) cmap;
    FT_UInt32   numRanges;
    FT_UInt     cnt;
    FT_UInt32*  q;


    cnt       = tt_cmap14_def_char_count( p );
    numRanges = (FT_UInt32)TT_NEXT_ULONG( p );

    if ( tt_cmap14_ensure( cmap14, ( cnt + 1 ), memory ) )
      return NULL;

    for ( q = cmap14->results; numRanges > 0; numRanges-- )
    {
      FT_UInt32  uni = (FT_UInt32)TT_NEXT_UINT24( p );


      cnt = FT_NEXT_BYTE( p ) + 1;
      do
      {
        q[0]  = uni;
        uni  += 1;
        q    += 1;

      } while ( --cnt != 0 );
    }
    q[0] = 0;

    return cmap14->results;
  }